

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O1

bool Ptex::v2_4::PtexWriter::applyEdits(char *path,String *error)

{
  int iVar1;
  MeshType mt;
  DataType dt;
  int alphachan;
  int nfaces;
  int iVar2;
  undefined4 extraout_var;
  PtexMainWriter *this;
  bool bVar3;
  PtexTexture *tex;
  
  bVar3 = false;
  iVar1 = PtexTexture::open((PtexTexture *)path,(char *)error,0);
  tex = (PtexTexture *)CONCAT44(extraout_var,iVar1);
  if (tex != (PtexTexture *)0x0) {
    iVar1 = (*tex->_vptr_PtexTexture[0xd])(tex);
    if ((char)iVar1 != '\0') {
      this = (PtexMainWriter *)operator_new(0x290);
      mt = (*tex->_vptr_PtexTexture[5])(tex);
      dt = (*tex->_vptr_PtexTexture[6])(tex);
      iVar1 = (*tex->_vptr_PtexTexture[0xb])(tex);
      alphachan = (*tex->_vptr_PtexTexture[10])(tex);
      nfaces = (*tex->_vptr_PtexTexture[0xc])(tex);
      iVar2 = (*tex->_vptr_PtexTexture[0xe])(tex);
      PtexMainWriter::PtexMainWriter(this,path,tex,mt,dt,iVar1,alphachan,nfaces,SUB41(iVar2,0));
      iVar1 = (*(this->super_PtexWriterBase).super_PtexWriter._vptr_PtexWriter[0xe])(this,error);
      (*(this->super_PtexWriterBase).super_PtexWriter._vptr_PtexWriter[2])(this);
      if ((char)iVar1 == '\0') {
        return false;
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool PtexWriter::applyEdits(const char* path, Ptex::String& error)
{
    // open reader for existing file
    PtexTexture* tex = PtexTexture::open(path, error);
    if (!tex) return 0;

    // see if we have any edits to apply
    if (tex->hasEdits()) {
        // create non-incremental writer
        PtexPtr<PtexWriter> w(new PtexMainWriter(path, tex, tex->meshType(), tex->dataType(),
                                                 tex->numChannels(), tex->alphaChannel(), tex->numFaces(),
                                                 tex->hasMipMaps()));
        // close to rebuild file
        if (!w->close(error)) return 0;
    }
    return 1;
}